

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O0

void AES_setup(AES_state *rounds,uint8_t *key,int nkeywords,int nrounds)

{
  long lVar1;
  int in_ECX;
  int in_EDX;
  AES_state *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int r;
  int b;
  int pos;
  int i;
  AES_state column;
  AES_state rcon;
  int in_stack_000000b4;
  AES_state *in_stack_000000b8;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int iVar2;
  int iVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = 0;
  for (iVar3 = 0; iVar3 < in_ECX + 1; iVar3 = iVar3 + 1) {
    for (in_stack_ffffffffffffffb4 = 0; in_stack_ffffffffffffffb4 < 8;
        in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
      *(undefined2 *)(in_RDI + (long)iVar3 * 0x10 + (long)in_stack_ffffffffffffffb4 * 2) = 0;
    }
  }
  for (iVar3 = 0; iVar3 < in_EDX; iVar3 = iVar3 + 1) {
    for (in_stack_ffffffffffffffb0 = 0; in_stack_ffffffffffffffb0 < 4;
        in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb0 + 1) {
      in_RSI = (AES_state *)((long)in_RSI->slice + 1);
      LoadByte((AES_state *)CONCAT44(iVar3,iVar2),(uchar)((uint)in_stack_ffffffffffffffb4 >> 0x18),
               in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    }
  }
  GetOneColumn((AES_state *)CONCAT44(iVar3,iVar2),
               (AES_state *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac);
  iVar3 = in_EDX;
  for (; in_EDX < (in_ECX + 1) * 4; in_EDX = in_EDX + 1) {
    if (iVar2 == 0) {
      SubBytes(in_stack_000000b8,in_stack_000000b4);
      KeySetupTransform((AES_state *)CONCAT44(in_EDX,iVar2),
                        (AES_state *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      MultX((AES_state *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    else if ((6 < iVar3) && (iVar2 == 4)) {
      SubBytes(in_stack_000000b8,in_stack_000000b4);
    }
    iVar2 = iVar2 + 1;
    if (iVar2 == iVar3) {
      iVar2 = 0;
    }
    KeySetupColumnMix(in_RSI,(AES_state *)CONCAT44(iVar3,in_ECX),(AES_state *)CONCAT44(in_EDX,iVar2)
                      ,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void AES_setup(AES_state* rounds, const uint8_t* key, int nkeywords, int nrounds)
{
    int i;

    /* The one-byte round constant */
    AES_state rcon = {{1,0,0,0,0,0,0,0}};
    /* The number of the word being generated, modulo nkeywords */
    int pos = 0;
    /* The column representing the word currently being processed */
    AES_state column;

    for (i = 0; i < nrounds + 1; i++) {
        int b;
        for (b = 0; b < 8; b++) {
            rounds[i].slice[b] = 0;
        }
    }

    /* The first nkeywords round columns are just taken from the key directly. */
    for (i = 0; i < nkeywords; i++) {
        int r;
        for (r = 0; r < 4; r++) {
            LoadByte(&rounds[i >> 2], *(key++), r, i & 3);
        }
    }

    GetOneColumn(&column, &rounds[(nkeywords - 1) >> 2], (nkeywords - 1) & 3);

    for (i = nkeywords; i < 4 * (nrounds + 1); i++) {
        /* Transform column */
        if (pos == 0) {
            SubBytes(&column, 0);
            KeySetupTransform(&column, &rcon);
            MultX(&rcon);
        } else if (nkeywords > 6 && pos == 4) {
            SubBytes(&column, 0);
        }
        if (++pos == nkeywords) pos = 0;
        KeySetupColumnMix(&column, &rounds[i >> 2], &rounds[(i - nkeywords) >> 2], i & 3, (i - nkeywords) & 3);
    }
}